

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# has_correlated_expressions.cpp
# Opt level: O2

unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> __thiscall
duckdb::HasCorrelatedExpressions::VisitReplace
          (HasCorrelatedExpressions *this,BoundColumnRefExpression *expr,
          unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *expr_ptr)

{
  ExpressionType *pEVar1;
  ExpressionClass EVar2;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var3;
  Expression *pEVar4;
  vector<duckdb::CorrelatedColumnInfo,_true> *this_00;
  ulong uVar5;
  ulong uVar6;
  const_reference pvVar7;
  BinderException *this_01;
  ulong __n;
  allocator local_51;
  string local_50;
  
  _Var3._M_head_impl =
       expr_ptr[0xd].super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
       _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t
       .super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
       super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
  pEVar4 = (Expression *)(expr->super_Expression).super_BaseExpression.alias._M_string_length;
  if (pEVar4 < _Var3._M_head_impl) {
    if ((undefined1 *)((long)&(pEVar4->super_BaseExpression)._vptr_BaseExpression + 1U) <
        _Var3._M_head_impl) {
      EVar2 = (expr->super_Expression).super_BaseExpression.expression_class;
      this_01 = (BinderException *)__cxa_allocate_exception(0x10);
      if (EVar2 == AGGREGATE) {
        ::std::__cxx11::string::string
                  ((string *)&local_50,"Invalid lateral depth encountered for an expression",
                   &local_51);
        BinderException::BinderException(this_01,&local_50);
        __cxa_throw(this_01,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
      }
      ::std::__cxx11::string::string
                ((string *)&local_50,"Expression with depth > 1 detected in non-lateral join",
                 &local_51);
      InternalException::InternalException((InternalException *)this_01,(string *)&local_50);
      __cxa_throw(this_01,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    uVar5 = 0;
    do {
      __n = uVar5;
      this_00 = (vector<duckdb::CorrelatedColumnInfo,_true> *)
                (expr->super_Expression).super_BaseExpression.alias._M_dataplus._M_p;
      uVar6 = ((long)(this_00->
                     super_vector<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
                     ).
                     super__Vector_base<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this_00->
                    super_vector<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
                    ).
                    super__Vector_base<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start) / 0x50;
      if (uVar6 <= __n) break;
      pvVar7 = vector<duckdb::CorrelatedColumnInfo,_true>::get<true>(this_00,__n);
      uVar5 = __n + 1;
    } while (((Expression *)(pvVar7->binding).table_index !=
              expr_ptr[0xb].
              super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
              super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
              _M_t.
              super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
              .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl) ||
            ((Expression *)(pvVar7->binding).column_index !=
             expr_ptr[0xc].
             super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
             super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
             _M_t.
             super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
             super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl));
    pEVar1 = &(expr->super_Expression).super_BaseExpression.type;
    *pEVar1 = *pEVar1 | __n < uVar6;
  }
  (this->super_LogicalOperatorVisitor)._vptr_LogicalOperatorVisitor = (_func_int **)0x0;
  return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)this;
}

Assistant:

unique_ptr<Expression> HasCorrelatedExpressions::VisitReplace(BoundColumnRefExpression &expr,
                                                              unique_ptr<Expression> *expr_ptr) {
	// Indicates local correlations (all correlations within a child) for the root
	if (expr.depth <= lateral_depth) {
		return nullptr;
	}

	// Should never happen
	if (expr.depth > 1 + lateral_depth) {
		if (lateral) {
			throw BinderException("Invalid lateral depth encountered for an expression");
		}
		throw InternalException("Expression with depth > 1 detected in non-lateral join");
	}
	// Note: This is added, since we only want to set has_correlated_expressions to true when the
	// BoundSubqueryExpression has the same bindings as one of the correlated_columns from the left hand side
	// (correlated_columns is the correlated_columns from left hand side)
	bool found_match = false;
	for (idx_t i = 0; i < correlated_columns.size(); i++) {
		if (correlated_columns[i].binding == expr.binding) {
			found_match = true;
			break;
		}
	}
	// correlated column reference
	D_ASSERT(expr.depth == lateral_depth + 1);
	has_correlated_expressions |= found_match;
	return nullptr;
}